

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::set_ctrl(raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
           *this,size_t i,ctrl_t h)

{
  bool bVar1;
  ctrl_t h_local;
  size_t i_local;
  raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  *this_local;
  
  if (i < this->capacity_) {
    bVar1 = IsFull(h);
    if (bVar1) {
      SanitizerUnpoisonObject<std::pair<unsigned_long_const,VarState>*>(this->slots_ + i);
    }
    else {
      SanitizerPoisonObject<std::pair<unsigned_long_const,VarState>*>(this->slots_ + i);
    }
    this->ctrl_[i] = h;
    this->ctrl_[(i - 0x10 & this->capacity_) + 1 + (this->capacity_ & 0xf)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x81d,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, VarState>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, VarState>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h) {
        assert(i < capacity_);

        if (IsFull(h)) {
            SanitizerUnpoisonObject(slots_ + i);
        } else {
            SanitizerPoisonObject(slots_ + i);
        }

        ctrl_[i] = h;
        ctrl_[((i - Group::kWidth) & capacity_) + 1 +
              ((Group::kWidth - 1) & capacity_)] = h;
    }